

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

Vec_Int_t * Sdb_StoFindAll(Vec_Wec_t *vCuts)

{
  int *piVar1;
  int Entry;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  ulong uVar2;
  ulong uVar3;
  int i;
  int i_00;
  
  p = Vec_IntAlloc(100);
  i = 0;
  do {
    if (vCuts->nSize <= i) {
      return p;
    }
    p_00 = Vec_WecEntry(vCuts,i);
    for (i_00 = 0; i_00 < p_00->nSize; i_00 = i_00 + 1) {
      Entry = Vec_IntEntry(p_00,i_00);
      uVar2 = (ulong)(uint)p->nSize;
      if (p->nSize < 1) {
        uVar2 = 0;
      }
      uVar3 = 0;
      do {
        if (uVar2 == uVar3) {
          Vec_IntPush(p,Entry);
          break;
        }
        piVar1 = p->pArray + uVar3;
        uVar3 = uVar3 + 1;
      } while (*piVar1 != Entry);
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Sdb_StoFindAll( Vec_Wec_t * vCuts )
{
    int i, k, Entry;
    Vec_Int_t * vCut, * vAll = Vec_IntAlloc( 100 );  
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntPushUnique( vAll, Entry );
    return vAll;
}